

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryop_x86_fma.cpp
# Opt level: O0

void ncnn::binary_op_vector_broadcast_a<ncnn::BinaryOp_x86_fma_functor::binary_op_mul>
               (float *ptr,float *ptr1,float *outptr,int size,int elempack)

{
  float fVar1;
  int in_ECX;
  float *in_RDX;
  float *in_RSI;
  float *in_RDI;
  int in_R8D;
  __m128 _outp_1;
  __m128 _b_1;
  __m256 _outp;
  __m256 _b;
  __m256 _a_256;
  __m128 _a_128;
  int i;
  float a;
  binary_op_mul op;
  undefined8 local_2a0;
  undefined8 uStack_298;
  undefined8 uStack_290;
  undefined8 uStack_288;
  undefined8 local_270;
  undefined8 uStack_268;
  int local_1bc;
  float *local_1a8;
  float *local_1a0;
  float local_a0;
  float fStack_9c;
  float fStack_98;
  float fStack_94;
  float fStack_90;
  float fStack_8c;
  float fStack_88;
  float local_80;
  float fStack_7c;
  float fStack_78;
  float fStack_74;
  float fStack_70;
  float fStack_6c;
  float fStack_68;
  undefined4 uStack_64;
  float local_50;
  float fStack_4c;
  float fStack_48;
  float fStack_44;
  float local_40;
  float fStack_3c;
  float fStack_38;
  float fStack_34;
  
  fVar1 = *in_RDI;
  local_1bc = 0;
  if (in_R8D == 4) {
    local_270 = *(undefined8 *)in_RDI;
    uStack_268 = *(undefined8 *)(in_RDI + 2);
  }
  else {
    local_270 = CONCAT44(fVar1,fVar1);
    uStack_268 = CONCAT44(fVar1,fVar1);
  }
  local_1a8 = in_RDX;
  local_1a0 = in_RSI;
  if (in_R8D == 8) {
    local_2a0 = *(undefined8 *)in_RDI;
    uStack_298 = *(undefined8 *)(in_RDI + 2);
    uStack_290 = *(undefined8 *)(in_RDI + 4);
    uStack_288 = *(undefined8 *)(in_RDI + 6);
  }
  else {
    local_2a0 = local_270;
    uStack_298 = uStack_268;
    uStack_290 = local_270;
    uStack_288 = uStack_268;
  }
  for (; local_1bc + 7 < in_ECX; local_1bc = local_1bc + 8) {
    local_80 = (float)local_2a0;
    fStack_7c = (float)((ulong)local_2a0 >> 0x20);
    fStack_78 = (float)uStack_298;
    fStack_74 = (float)((ulong)uStack_298 >> 0x20);
    fStack_70 = (float)uStack_290;
    fStack_6c = (float)((ulong)uStack_290 >> 0x20);
    fStack_68 = (float)uStack_288;
    uStack_64 = (undefined4)((ulong)uStack_288 >> 0x20);
    local_a0 = (float)*(undefined8 *)local_1a0;
    fStack_9c = (float)((ulong)*(undefined8 *)local_1a0 >> 0x20);
    fStack_98 = (float)*(undefined8 *)(local_1a0 + 2);
    fStack_94 = (float)((ulong)*(undefined8 *)(local_1a0 + 2) >> 0x20);
    fStack_90 = (float)*(undefined8 *)(local_1a0 + 4);
    fStack_8c = (float)((ulong)*(undefined8 *)(local_1a0 + 4) >> 0x20);
    fStack_88 = (float)*(undefined8 *)(local_1a0 + 6);
    *(ulong *)local_1a8 = CONCAT44(fStack_7c * fStack_9c,local_80 * local_a0);
    *(ulong *)(local_1a8 + 2) = CONCAT44(fStack_74 * fStack_94,fStack_78 * fStack_98);
    *(ulong *)(local_1a8 + 4) = CONCAT44(fStack_6c * fStack_8c,fStack_70 * fStack_90);
    *(ulong *)(local_1a8 + 6) = CONCAT44(uStack_64,fStack_68 * fStack_88);
    local_1a0 = local_1a0 + 8;
    local_1a8 = local_1a8 + 8;
  }
  for (; local_1bc + 3 < in_ECX; local_1bc = local_1bc + 4) {
    local_40 = (float)local_270;
    fStack_3c = (float)((ulong)local_270 >> 0x20);
    fStack_38 = (float)uStack_268;
    fStack_34 = (float)((ulong)uStack_268 >> 0x20);
    local_50 = (float)*(undefined8 *)local_1a0;
    fStack_4c = (float)((ulong)*(undefined8 *)local_1a0 >> 0x20);
    fStack_48 = (float)*(undefined8 *)(local_1a0 + 2);
    fStack_44 = (float)((ulong)*(undefined8 *)(local_1a0 + 2) >> 0x20);
    *(ulong *)local_1a8 = CONCAT44(fStack_3c * fStack_4c,local_40 * local_50);
    *(ulong *)(local_1a8 + 2) = CONCAT44(fStack_34 * fStack_44,fStack_38 * fStack_48);
    local_1a0 = local_1a0 + 4;
    local_1a8 = local_1a8 + 4;
  }
  for (; local_1bc < in_ECX; local_1bc = local_1bc + 1) {
    *local_1a8 = fVar1 * *local_1a0;
    local_1a0 = local_1a0 + 1;
    local_1a8 = local_1a8 + 1;
  }
  return;
}

Assistant:

static void binary_op_vector_broadcast_a(const float* ptr, const float* ptr1, float* outptr, int size, int elempack)
{
    const Op op;

    const float a = *ptr;

    int i = 0;
#if __SSE2__
    __m128 _a_128 = (elempack == 4) ? _mm_loadu_ps(ptr) : _mm_set1_ps(a);
#if __AVX__
    __m256 _a_256 = (elempack == 8) ? _mm256_loadu_ps(ptr) : _mm256_insertf128_ps(_mm256_castps128_ps256(_a_128), _a_128, 1);
#if __AVX512F__
    __m512 _a_512 = (elempack == 16) ? _mm512_loadu_ps(ptr) : _mm512_insertf32x8(_mm512_castps256_ps512(_a_256), _a_256, 1);
    for (; i + 15 < size; i += 16)
    {
        __m512 _b = _mm512_loadu_ps(ptr1);
        __m512 _outp = op.func_pack16(_a_512, _b);
        _mm512_storeu_ps(outptr, _outp);
        ptr1 += 16;
        outptr += 16;
    }
#endif // __AVX512F__
    for (; i + 7 < size; i += 8)
    {
        __m256 _b = _mm256_loadu_ps(ptr1);
        __m256 _outp = op.func_pack8(_a_256, _b);
        _mm256_storeu_ps(outptr, _outp);
        ptr1 += 8;
        outptr += 8;
    }
#endif // __AVX__
    for (; i + 3 < size; i += 4)
    {
        __m128 _b = _mm_loadu_ps(ptr1);
        __m128 _outp = op.func_pack4(_a_128, _b);
        _mm_storeu_ps(outptr, _outp);
        ptr1 += 4;
        outptr += 4;
    }
#endif // __SSE2__
    for (; i < size; i++)
    {
        *outptr = op.func(a, *ptr1);
        ptr1 += 1;
        outptr += 1;
    }
}